

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

void __thiscall
libcellml::Validator::ValidatorImpl::validateEquivalenceUnits
          (ValidatorImpl *this,ModelPtr *model,VariablePtr *variable,VariableMap *alreadyReported)

{
  element_type *peVar1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  size_t sVar4;
  long *plVar5;
  undefined8 *puVar6;
  _Atomic_word _Var7;
  long *plVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  ulong *puVar10;
  element_type *peVar11;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  __it;
  long lVar12;
  _func_int **pp_Var13;
  ulong uVar14;
  undefined8 uVar15;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  __it_00;
  ulong uVar16;
  long lVar17;
  VariablePtr equivalentVariable;
  IssuePtr err;
  ComponentPtr equivalentComponent;
  string hints;
  double multiplier;
  ComponentPtr parentComponent;
  VariablePairPtr pair;
  undefined1 local_368 [32];
  element_type *local_348;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_340;
  element_type local_338;
  undefined1 local_318 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_300;
  IssueImpl *local_2f8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_2f0;
  long local_2e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_2e0;
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  long *local_2b0;
  undefined8 local_2a8;
  long local_2a0;
  undefined8 uStack_298;
  long *local_290;
  undefined8 local_288;
  long local_280;
  undefined8 uStack_278;
  long *local_270;
  undefined8 local_268;
  long local_260;
  undefined8 uStack_258;
  long *local_250;
  undefined8 local_248;
  long local_240;
  undefined8 uStack_238;
  VariableMap *local_230;
  ulong *local_228;
  long local_220;
  ulong local_218;
  long lStack_210;
  ulong *local_208;
  long local_200;
  ulong local_1f8;
  long lStack_1f0;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8;
  long lStack_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  long lStack_1b0;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  IssuePtr local_108;
  ParentedEntityConstPtr local_f8;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  string local_c8;
  ValidatorImpl *local_a8;
  ModelPtr *local_a0;
  NamedEntity *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  NamedEntity *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  double local_78;
  ParentedEntityConstPtr local_70;
  string local_60;
  value_type local_40;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_368._0_8_ =
       (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_368._8_8_ =
       (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_)->_M_use_count + 1;
    }
  }
  local_230 = alreadyReported;
  local_a8 = this;
  local_a0 = model;
  owningComponent(&local_70);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
  }
  Variable::units((variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr);
  uVar15 = local_368._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
  }
  if ((element_type *)uVar15 != (element_type *)0x0) {
    uVar16 = 0;
    while( true ) {
      sVar4 = Variable::equivalentVariableCount
                        ((variable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                        );
      if (sVar4 <= uVar16) break;
      Variable::equivalentVariable
                ((Variable *)(local_318 + 0x10),
                 (size_t)(variable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                );
      local_368._0_8_ = local_318._16_8_;
      local_368._8_8_ = local_300._M_pi;
      if (local_300._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_300._M_pi)->_M_use_count = (local_300._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_300._M_pi)->_M_use_count = (local_300._M_pi)->_M_use_count + 1;
        }
      }
      owningComponent(&local_f8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
      }
      if ((local_f8.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != (element_type *)0x0) &&
         (bVar3 = ImportedEntity::isImport
                            ((ImportedEntity *)
                             (local_f8.
                              super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 1)), !bVar3)) {
        Variable::units((Variable *)local_318._16_8_);
        uVar15 = local_368._0_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
        }
        if ((element_type *)uVar15 != (element_type *)0x0) {
          local_78 = 0.0;
          bVar3 = unitsAreEquivalent(local_a0,variable,(VariablePtr *)(local_318 + 0x10),&local_c8,
                                     &local_78);
          _Var2._M_pi = local_300._M_pi;
          uVar15 = local_318._16_8_;
          if (!bVar3) {
            __it_00._M_current =
                 (local_230->
                 super__Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
            local_2f8 = (IssueImpl *)
                        (local_230->
                        super__Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            local_e8 = (element_type *)local_318._16_8_;
            local_e0 = local_300._M_pi;
            if (local_300._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_300._M_pi)->_M_use_count = (local_300._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_300._M_pi)->_M_use_count = (local_300._M_pi)->_M_use_count + 1;
              }
            }
            local_338.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                 (_func_int **)
                 (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
            local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
                 (EntityImpl *)
                 (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->
                       _M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->
                       _M_use_count + 1;
              }
            }
            if (local_300._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_300._M_pi)->_M_use_count = (local_300._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_300._M_pi)->_M_use_count = (local_300._M_pi)->_M_use_count + 1;
              }
            }
            local_318._0_8_ =
                 local_338.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
            local_d8 = (element_type *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
            local_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_002787b9:
              local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_318._16_8_;
              local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   local_300._M_pi;
              p_Stack_340 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_348 = (element_type *)0x0;
              local_318._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            else {
              local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_318._16_8_;
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->
                       _M_use_count + 1;
                UNLOCK();
                local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     = local_300._M_pi;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl ==
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_002787b9;
                if (__libc_single_threaded != '\0') goto LAB_0027877f;
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->
                       _M_use_count + 1;
                UNLOCK();
                if (__libc_single_threaded != '\0') {
                  _Var7 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->
                          _M_use_count;
                  goto LAB_0027879b;
                }
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->
                       _M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->
                       _M_use_count + 1;
LAB_0027877f:
                _Var7 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->
                        _M_use_count + 1;
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->_M_use_count
                     = _Var7;
                local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     = local_300._M_pi;
LAB_0027879b:
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->_M_use_count
                     = _Var7 + 1;
              }
              p_Stack_340 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_348 = (element_type *)0x0;
              local_318._8_8_ = local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl
              ;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
            }
            if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
              }
            }
            local_368._16_8_ = local_318._0_8_;
            local_368._24_8_ = local_318._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_318._8_8_ + 8) = *(_Atomic_word *)(local_318._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_318._8_8_ + 8) = *(_Atomic_word *)(local_318._8_8_ + 8) + 1;
              }
            }
            lVar17 = (long)local_2f8 - (long)__it_00._M_current;
            local_368._0_8_ = uVar15;
            local_368._8_8_ = _Var2._M_pi;
            if (0 < lVar17 >> 6) {
              lVar12 = (lVar17 >> 6) + 1;
              do {
                bVar3 = __gnu_cxx::__ops::
                        _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                        ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                      *)local_368,__it_00);
                __it._M_current = __it_00._M_current;
                if (bVar3) goto LAB_0027899e;
                bVar3 = __gnu_cxx::__ops::
                        _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                        ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                      *)local_368,__it_00._M_current + 1);
                __it._M_current = __it_00._M_current + 1;
                if (bVar3) goto LAB_0027899e;
                bVar3 = __gnu_cxx::__ops::
                        _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                        ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                      *)local_368,__it_00._M_current + 2);
                __it._M_current = __it_00._M_current + 2;
                if (bVar3) goto LAB_0027899e;
                bVar3 = __gnu_cxx::__ops::
                        _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                        ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                      *)local_368,__it_00._M_current + 3);
                __it._M_current = __it_00._M_current + 3;
                if (bVar3) goto LAB_0027899e;
                __it_00._M_current = __it_00._M_current + 4;
                lVar12 = lVar12 + -1;
                lVar17 = lVar17 + -0x40;
              } while (1 < lVar12);
            }
            lVar17 = lVar17 >> 4;
            if (lVar17 == 1) {
LAB_00278988:
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                      ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                    *)local_368,__it_00);
              __it._M_current = (shared_ptr<libcellml::VariablePair> *)local_2f8;
              if (bVar3) {
                __it._M_current = __it_00._M_current;
              }
            }
            else {
              __it._M_current = __it_00._M_current;
              if (lVar17 == 2) {
LAB_0027894f:
                bVar3 = __gnu_cxx::__ops::
                        _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                        ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                      *)local_368,__it);
                if (!bVar3) {
                  __it_00._M_current = __it._M_current + 1;
                  goto LAB_00278988;
                }
              }
              else {
                __it._M_current = (shared_ptr<libcellml::VariablePair> *)local_2f8;
                if ((lVar17 == 3) &&
                   (bVar3 = __gnu_cxx::__ops::
                            _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                            ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                          *)local_368,__it_00), __it._M_current = __it_00._M_current
                   , !bVar3)) {
                  __it._M_current = __it_00._M_current + 1;
                  goto LAB_0027894f;
                }
              }
            }
LAB_0027899e:
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._24_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._24_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_);
            }
            if (local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                         super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
            }
            if (p_Stack_340 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_340);
            }
            if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
            }
            if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
            }
            if ((IssueImpl *)__it._M_current ==
                (IssueImpl *)
                (local_230->
                super__Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              VariablePair::create
                        ((VariablePair *)&local_40,variable,(VariablePtr *)(local_318 + 0x10));
              std::
              vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
              ::push_back(local_230,&local_40);
              Issue::IssueImpl::create();
              local_2f8 = (local_108.
                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->mPimpl;
              NamedEntity::name_abi_cxx11_
                        (&local_60,
                         &((variable->
                           super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->super_NamedEntity);
              plVar5 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_60,0,(char *)0x0,0x28fa35);
              plVar8 = plVar5 + 2;
              if ((long *)*plVar5 == plVar8) {
                local_2c0 = *plVar8;
                lStack_2b8 = plVar5[3];
                local_2d0 = &local_2c0;
              }
              else {
                local_2c0 = *plVar8;
                local_2d0 = (long *)*plVar5;
              }
              local_2c8 = plVar5[1];
              *plVar5 = (long)plVar8;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d0);
              p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar5 + 2);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar5 == p_Var9) {
                local_2e0._vptr__Sp_counted_base = p_Var9->_vptr__Sp_counted_base;
                local_2e0._8_8_ = plVar5[3];
                local_2f0._M_pi = &local_2e0;
              }
              else {
                local_2e0._vptr__Sp_counted_base = p_Var9->_vptr__Sp_counted_base;
                local_2f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar5;
              }
              local_2e8 = plVar5[1];
              *plVar5 = (long)p_Var9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              NamedEntity::name_abi_cxx11_
                        (&local_128,
                         (NamedEntity *)
                         local_70.
                         super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
              pp_Var13 = (_func_int **)0xf;
              if (local_2f0._M_pi != &local_2e0) {
                pp_Var13 = local_2e0._vptr__Sp_counted_base;
              }
              if (pp_Var13 < (_func_int **)(local_128._M_string_length + local_2e8)) {
                uVar15 = (_func_int **)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_128._M_dataplus._M_p != &local_128.field_2) {
                  uVar15 = local_128.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar15 < (_func_int **)(local_128._M_string_length + local_2e8))
                goto LAB_00278bc0;
                puVar6 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_128,0,(char *)0x0,(ulong)local_2f0._M_pi);
              }
              else {
LAB_00278bc0:
                puVar6 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_2f0,(ulong)local_128._M_dataplus._M_p);
              }
              local_2b0 = &local_2a0;
              plVar5 = puVar6 + 2;
              if ((long *)*puVar6 == plVar5) {
                local_2a0 = *plVar5;
                uStack_298 = puVar6[3];
              }
              else {
                local_2a0 = *plVar5;
                local_2b0 = (long *)*puVar6;
              }
              local_2a8 = puVar6[1];
              *puVar6 = plVar5;
              puVar6[1] = 0;
              *(undefined1 *)plVar5 = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
              local_228 = &local_218;
              puVar10 = (ulong *)(plVar5 + 2);
              if ((ulong *)*plVar5 == puVar10) {
                local_218 = *puVar10;
                lStack_210 = plVar5[3];
              }
              else {
                local_218 = *puVar10;
                local_228 = (ulong *)*plVar5;
              }
              local_220 = plVar5[1];
              *plVar5 = (long)puVar10;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              Variable::units((variable->
                              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
              NamedEntity::name_abi_cxx11_(&local_148,local_88);
              uVar14 = 0xf;
              if (local_228 != &local_218) {
                uVar14 = local_218;
              }
              if (uVar14 < local_148._M_string_length + local_220) {
                uVar15 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._M_dataplus._M_p != &local_148.field_2) {
                  uVar15 = local_148.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar15 < local_148._M_string_length + local_220) goto LAB_00278d24;
                puVar6 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_148,0,(char *)0x0,(ulong)local_228);
              }
              else {
LAB_00278d24:
                puVar6 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_228,(ulong)local_148._M_dataplus._M_p);
              }
              local_290 = &local_280;
              plVar5 = puVar6 + 2;
              if ((long *)*puVar6 == plVar5) {
                local_280 = *plVar5;
                uStack_278 = puVar6[3];
              }
              else {
                local_280 = *plVar5;
                local_290 = (long *)*puVar6;
              }
              local_288 = puVar6[1];
              *puVar6 = plVar5;
              puVar6[1] = 0;
              *(undefined1 *)plVar5 = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_290);
              local_208 = &local_1f8;
              puVar10 = (ulong *)(plVar5 + 2);
              if ((ulong *)*plVar5 == puVar10) {
                local_1f8 = *puVar10;
                lStack_1f0 = plVar5[3];
              }
              else {
                local_1f8 = *puVar10;
                local_208 = (ulong *)*plVar5;
              }
              local_200 = plVar5[1];
              *plVar5 = (long)puVar10;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              NamedEntity::name_abi_cxx11_(&local_168,(NamedEntity *)local_318._16_8_);
              uVar14 = 0xf;
              if (local_208 != &local_1f8) {
                uVar14 = local_1f8;
              }
              if (uVar14 < local_168._M_string_length + local_200) {
                uVar15 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p != &local_168.field_2) {
                  uVar15 = local_168.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar15 < local_168._M_string_length + local_200) goto LAB_00278e78;
                puVar6 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_168,0,(char *)0x0,(ulong)local_208);
              }
              else {
LAB_00278e78:
                puVar6 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_208,(ulong)local_168._M_dataplus._M_p);
              }
              local_270 = &local_260;
              plVar5 = puVar6 + 2;
              if ((long *)*puVar6 == plVar5) {
                local_260 = *plVar5;
                uStack_258 = puVar6[3];
              }
              else {
                local_260 = *plVar5;
                local_270 = (long *)*puVar6;
              }
              local_268 = puVar6[1];
              *puVar6 = plVar5;
              puVar6[1] = 0;
              *(undefined1 *)plVar5 = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_270);
              local_1e8 = &local_1d8;
              puVar10 = (ulong *)(plVar5 + 2);
              if ((ulong *)*plVar5 == puVar10) {
                local_1d8 = *puVar10;
                lStack_1d0 = plVar5[3];
              }
              else {
                local_1d8 = *puVar10;
                local_1e8 = (ulong *)*plVar5;
              }
              local_1e0 = plVar5[1];
              *plVar5 = (long)puVar10;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              NamedEntity::name_abi_cxx11_
                        (&local_188,
                         (NamedEntity *)
                         local_f8.
                         super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
              uVar14 = 0xf;
              if (local_1e8 != &local_1d8) {
                uVar14 = local_1d8;
              }
              if (uVar14 < local_188._M_string_length + local_1e0) {
                uVar15 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_dataplus._M_p != &local_188.field_2) {
                  uVar15 = local_188.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar15 < local_188._M_string_length + local_1e0) goto LAB_00278fcf;
                puVar6 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_188,0,(char *)0x0,(ulong)local_1e8);
              }
              else {
LAB_00278fcf:
                puVar6 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_1e8,(ulong)local_188._M_dataplus._M_p);
              }
              local_250 = &local_240;
              plVar5 = puVar6 + 2;
              if ((long *)*puVar6 == plVar5) {
                local_240 = *plVar5;
                uStack_238 = puVar6[3];
              }
              else {
                local_240 = *plVar5;
                local_250 = (long *)*puVar6;
              }
              local_248 = puVar6[1];
              *puVar6 = plVar5;
              puVar6[1] = 0;
              *(undefined1 *)plVar5 = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
              local_1c8 = &local_1b8;
              puVar10 = (ulong *)(plVar5 + 2);
              if ((ulong *)*plVar5 == puVar10) {
                local_1b8 = *puVar10;
                lStack_1b0 = plVar5[3];
              }
              else {
                local_1b8 = *puVar10;
                local_1c8 = (ulong *)*plVar5;
              }
              local_1c0 = plVar5[1];
              *plVar5 = (long)puVar10;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              Variable::units((Variable *)local_318._16_8_);
              NamedEntity::name_abi_cxx11_(&local_1a8,local_98);
              uVar14 = 0xf;
              if (local_1c8 != &local_1b8) {
                uVar14 = local_1b8;
              }
              if (uVar14 < local_1a8._M_string_length + local_1c0) {
                uVar15 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                  uVar15 = local_1a8.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar15 < local_1a8._M_string_length + local_1c0) goto LAB_00279138;
                plVar5 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_1a8,0,(char *)0x0,(ulong)local_1c8);
              }
              else {
LAB_00279138:
                plVar5 = (long *)std::__cxx11::string::_M_append
                                           ((char *)&local_1c8,(ulong)local_1a8._M_dataplus._M_p);
              }
              local_348 = &local_338;
              peVar1 = (element_type *)(plVar5 + 2);
              if ((element_type *)*plVar5 == peVar1) {
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                     (peVar1->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
                     (EntityImpl *)plVar5[3];
              }
              else {
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                     (peVar1->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_348 = (element_type *)*plVar5;
              }
              p_Stack_340 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
              *plVar5 = (long)peVar1;
              plVar5[1] = 0;
              *(undefined1 *)
               &(peVar1->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_348);
              local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_318;
              peVar11 = (element_type *)(plVar5 + 2);
              if ((element_type *)*plVar5 == peVar11) {
                local_318._0_8_ =
                     (peVar11->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_318._8_8_ = plVar5[3];
              }
              else {
                local_318._0_8_ =
                     (peVar11->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)*plVar5;
              }
              local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
              *plVar5 = (long)peVar11;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_338.
                                                                                                      
                                                  super_enable_shared_from_this<libcellml::Variable>
                                          ,(ulong)local_c8._M_dataplus._M_p);
              local_368._0_8_ = local_368 + 0x10;
              peVar11 = (element_type *)(plVar5 + 2);
              if ((element_type *)*plVar5 == peVar11) {
                local_368._16_8_ =
                     (peVar11->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_368._24_8_ = plVar5[3];
              }
              else {
                local_368._16_8_ =
                     (peVar11->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_368._0_8_ = (element_type *)*plVar5;
              }
              local_368._8_8_ = plVar5[1];
              *plVar5 = (long)peVar11;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              Issue::IssueImpl::setDescription(local_2f8,(string *)local_368);
              if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
                operator_delete((void *)local_368._0_8_,(ulong)(local_368._16_8_ + 1));
              }
              if (local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)local_318) {
                operator_delete(local_338.super_enable_shared_from_this<libcellml::Variable>.
                                _M_weak_this.
                                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,(ulong)((long)&(((NamedEntity *)local_318._0_8_)->
                                                      super_ParentedEntity).super_Entity.
                                                      _vptr_Entity + 1));
              }
              if (local_348 != &local_338) {
                operator_delete(local_348,
                                (ulong)((long)&(((NamedEntity *)
                                                local_338.super_NamedEntity.super_ParentedEntity.
                                                super_Entity._vptr_Entity)->super_ParentedEntity).
                                               super_Entity._vptr_Entity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
              }
              if (local_1c8 != &local_1b8) {
                operator_delete(local_1c8,local_1b8 + 1);
              }
              if (local_250 != &local_240) {
                operator_delete(local_250,local_240 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              if (local_1e8 != &local_1d8) {
                operator_delete(local_1e8,local_1d8 + 1);
              }
              if (local_270 != &local_260) {
                operator_delete(local_270,local_260 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity + 1);
              }
              if (local_208 != &local_1f8) {
                operator_delete(local_208,local_1f8 + 1);
              }
              if (local_290 != &local_280) {
                operator_delete(local_290,local_280 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                local_148.field_2._M_allocated_capacity + 1);
              }
              if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
              }
              if (local_228 != &local_218) {
                operator_delete(local_228,local_218 + 1);
              }
              if (local_2b0 != &local_2a0) {
                operator_delete(local_2b0,local_2a0 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
              if (local_2f0._M_pi != &local_2e0) {
                operator_delete(local_2f0._M_pi,(long)local_2e0._vptr__Sp_counted_base + 1);
              }
              if (local_2d0 != &local_2c0) {
                operator_delete(local_2d0,local_2c0 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
              AnyCellmlElement::AnyCellmlElementImpl::setMapVariables
                        ((((local_108.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->mPimpl->mItem).
                          super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,variable,(VariablePtr *)(local_318 + 0x10));
              Issue::IssueImpl::setReferenceRule
                        ((local_108.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,MAP_VARIABLES_ELEMENT);
              Logger::LoggerImpl::addIssue(&local_a8->super_LoggerImpl,&local_108);
              if (local_108.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_108.
                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_40.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_40.
                           super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
          }
        }
      }
      if (local_f8.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_f8.
                   super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_300._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_300._M_pi);
      }
      uVar16 = uVar16 + 1;
    }
  }
  if (local_70.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.
               super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Validator::ValidatorImpl::validateEquivalenceUnits(const ModelPtr &model, const VariablePtr &variable, VariableMap &alreadyReported)
{
    std::string hints;
    ComponentPtr parentComponent = owningComponent(variable);

    if (variable->units() == nullptr) {
        // If the variable has no units, don't check it.
        return;
    }

    for (size_t index = 0; index < variable->equivalentVariableCount(); ++index) {
        auto equivalentVariable = variable->equivalentVariable(index);

        // If the parent component of the variable is nonexistent or imported, don't check it.
        auto equivalentComponent = owningComponent(equivalentVariable);
        if ((equivalentComponent == nullptr) || equivalentComponent->isImport()) {
            continue;
        }

        // If the equivalent variable has no units, don't check it.
        if (equivalentVariable->units() == nullptr) {
            continue;
        }

        double multiplier = 0.0;
        if (!unitsAreEquivalent(model, variable, equivalentVariable, hints, multiplier)) {
            auto it = std::find_if(alreadyReported.begin(), alreadyReported.end(),
                                   [equivalentVariable, variable](const VariablePairPtr &in) {
                                       return (in->variable1() == equivalentVariable) && (in->variable2() == variable);
                                   });
            if (it == alreadyReported.end()) {
                VariablePairPtr pair = VariablePair::create(variable, equivalentVariable);
                alreadyReported.push_back(pair);
                IssuePtr err = Issue::IssueImpl::create();
                err->mPimpl->setDescription("Variable '" + variable->name() + "' in component '" + parentComponent->name() + "' has units of '" + variable->units()->name() + "' and an equivalent variable '" + equivalentVariable->name() + "' in component '" + equivalentComponent->name() + "' with non-matching units of '" + equivalentVariable->units()->name() + "'. The mismatch is: " + hints);
                err->mPimpl->mItem->mPimpl->setMapVariables(variable, equivalentVariable);
                err->mPimpl->setReferenceRule(Issue::ReferenceRule::MAP_VARIABLES_ELEMENT);
                addIssue(err);
            }
        }
    }
}